

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

bool __thiscall
pybind11::detail::
object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
contains<char_const(&)[9]>
          (object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>
           *this,char (*item) [9])

{
  bool bVar1;
  char *in_stack_ffffffffffffffd0;
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>
  *in_stack_ffffffffffffffd8;
  char (*in_stack_ffffffffffffffe0) [9];
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>
  *in_stack_ffffffffffffffe8;
  
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>::attr
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  operator()(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  bVar1 = object::cast<bool>((object *)0x16db39);
  object::~object((object *)0x16db49);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
            ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x16db53);
  return bVar1;
}

Assistant:

bool object_api<D>::contains(T &&item) const {
    return attr("__contains__")(std::forward<T>(item)).template cast<bool>();
}